

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

Datatype * __thiscall TypeOpCpoolref::getOutputLocal(TypeOpCpoolref *this,PcodeOp *op)

{
  int4 iVar1;
  int iVar2;
  uint4 uVar3;
  Varnode *this_00;
  undefined4 extraout_var;
  CPoolRecord *rec;
  int local_3c;
  undefined1 local_38 [4];
  int4 i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> refs;
  PcodeOp *op_local;
  TypeOpCpoolref *this_local;
  CPoolRecord *this_01;
  
  refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)op;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  local_3c = 1;
  while( true ) {
    iVar2 = local_3c;
    iVar1 = PcodeOp::numInput((PcodeOp *)
                              refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar1 <= iVar2) break;
    this_00 = PcodeOp::getIn((PcodeOp *)
                             refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_3c);
    rec = (CPoolRecord *)Varnode::getOffset(this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
               (value_type_conflict *)&rec);
    local_3c = local_3c + 1;
  }
  iVar2 = (*this->cpool->_vptr_ConstantPool[3])(this->cpool,local_38);
  this_01 = (CPoolRecord *)CONCAT44(extraout_var,iVar2);
  if (this_01 == (CPoolRecord *)0x0) {
    this_local = (TypeOpCpoolref *)
                 TypeOp::getOutputLocal
                           (&this->super_TypeOp,
                            (PcodeOp *)
                            refs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    uVar3 = CPoolRecord::getTag(this_01);
    if (uVar3 == 6) {
      this_local = (TypeOpCpoolref *)TypeFactory::getBase((this->super_TypeOp).tlst,1,TYPE_BOOL);
    }
    else {
      this_local = (TypeOpCpoolref *)CPoolRecord::getType(this_01);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return (Datatype *)this_local;
}

Assistant:

Datatype *TypeOpCpoolref::getOutputLocal(const PcodeOp *op) const

{
  vector<uintb> refs;
  for(int4 i=1;i<op->numInput();++i)
    refs.push_back(op->getIn(i)->getOffset());
  const CPoolRecord *rec = cpool->getRecord(refs);
  if (rec == (const CPoolRecord *)0)
    return TypeOp::getOutputLocal(op);
  if (rec->getTag() == CPoolRecord::instance_of)
    return tlst->getBase(1,TYPE_BOOL);
  return rec->getType();
}